

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O2

void __thiscall
Diligent::DearchiverBase::UnpackPipelineStateImpl<Diligent::GraphicsPipelineStateCreateInfo>
          (DearchiverBase *this,PipelineStateUnpackInfo *UnpackInfo,IPipelineState **ppPSO)

{
  IPipelineResourceSignature *pIVar1;
  IPipelineResourceSignature *pIVar2;
  long lVar3;
  long lVar4;
  PIPELINE_TYPE PVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  ArchiveData *Archive;
  IMemoryAllocator *Allocator;
  undefined4 extraout_var;
  ulong uVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char (*in_RCX) [30];
  pointer pIVar10;
  long lVar11;
  ulong uVar12;
  ShaderResourceVariableDesc *Var;
  pointer pSVar13;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar14;
  string _msg;
  PipelineResourceLayoutDesc ResourceLayout;
  vector<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
  pSignatures;
  vector<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
  ImmutableSamplers;
  vector<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
  Variables;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  Strings;
  PSOData<Diligent::GraphicsPipelineStateCreateInfo> PSO;
  
  if (UnpackInfo->pDevice == (IRenderDevice *)0x0) {
    FormatString<char[26],char[30]>
              ((string *)&PSO,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"UnpackInfo.pDevice != nullptr",in_RCX);
    DebugAssertionFailed
              ((Char *)PSO.Allocator.m_Blocks.
                       super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
                       ._M_impl.super__Vector_impl_data._M_start,"UnpackPipelineStateImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
               ,0x254);
    std::__cxx11::string::~string((string *)&PSO);
  }
  if ((UnpackInfo->ModifyPipelineStateCreateInfo ==
       (_func_void_PipelineStateCreateInfo_ptr_void_ptr *)0x0) &&
     (bVar6 = NamedResourceCache<Diligent::IPipelineState>::Get
                        (&(this->m_Cache).PSO,GraphicsPipeline,UnpackInfo->Name,ppPSO), bVar6)) {
    return;
  }
  Archive = FindArchive(this,GraphicsPipeline,UnpackInfo->Name);
  if (Archive == (ArchiveData *)0x0) {
    return;
  }
  Allocator = GetRawAllocator();
  PSOData<Diligent::GraphicsPipelineStateCreateInfo>::PSOData(&PSO,Allocator,0x800);
  bVar6 = DeviceObjectArchive::
          LoadResourceCommonData<Diligent::DearchiverBase::PSOData<Diligent::GraphicsPipelineStateCreateInfo>>
                    ((Archive->pObjArchive)._M_t.
                     super___uniq_ptr_impl<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_const_Diligent::DeviceObjectArchive_*,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
                     .super__Head_base<0UL,_const_Diligent::DeviceObjectArchive_*,_false>.
                     _M_head_impl,GraphicsPipeline,UnpackInfo->Name,&PSO);
  if (!bVar6) goto LAB_003e03fa;
  iVar7 = (*(UnpackInfo->pDevice->super_IObject)._vptr_IObject[0x18])();
  if (*(int *)CONCAT44(extraout_var,iVar7) - 1U < 2) {
    PSO.InternalCI.Flags._0_1_ = (undefined1)PSO.InternalCI.Flags & 0xfd;
  }
  bVar6 = UnpackPSORenderPass<Diligent::GraphicsPipelineStateCreateInfo>
                    (this,&PSO,UnpackInfo->pDevice);
  if (((!bVar6) ||
      (bVar6 = UnpackPSOSignatures<Diligent::GraphicsPipelineStateCreateInfo>
                         (this,&PSO,UnpackInfo->pDevice), !bVar6)) ||
     (bVar6 = UnpackPSOShaders<Diligent::GraphicsPipelineStateCreateInfo>
                        (this,Archive,&PSO,UnpackInfo->pDevice), !bVar6)) goto LAB_003e03fa;
  PSOData<Diligent::GraphicsPipelineStateCreateInfo>::AssignShaders(&PSO);
  PVar5 = PSO.CreateInfo.super_PipelineStateCreateInfo.PSODesc.PipelineType;
  PSO.CreateInfo.super_PipelineStateCreateInfo.PSODesc.SRBAllocationGranularity =
       UnpackInfo->SRBAllocationGranularity;
  PSO.CreateInfo.super_PipelineStateCreateInfo.PSODesc.ImmediateContextMask =
       UnpackInfo->ImmediateContextMask;
  PSO.CreateInfo.super_PipelineStateCreateInfo.pPSOCache = UnpackInfo->pCache;
  if (UnpackInfo->ModifyPipelineStateCreateInfo !=
      (_func_void_PipelineStateCreateInfo_ptr_void_ptr *)0x0) {
    ResourceLayout.ImmutableSamplers =
         PSO.CreateInfo.super_PipelineStateCreateInfo.PSODesc.ResourceLayout.ImmutableSamplers;
    ResourceLayout.Variables =
         PSO.CreateInfo.super_PipelineStateCreateInfo.PSODesc.ResourceLayout.Variables;
    ResourceLayout.NumImmutableSamplers =
         PSO.CreateInfo.super_PipelineStateCreateInfo.PSODesc.ResourceLayout.NumImmutableSamplers;
    ResourceLayout._28_4_ =
         PSO.CreateInfo.super_PipelineStateCreateInfo.PSODesc.ResourceLayout._28_4_;
    ResourceLayout.DefaultVariableType =
         PSO.CreateInfo.super_PipelineStateCreateInfo.PSODesc.ResourceLayout.DefaultVariableType;
    ResourceLayout._1_3_ = PSO.CreateInfo.super_PipelineStateCreateInfo.PSODesc.ResourceLayout._1_3_
    ;
    ResourceLayout.DefaultVariableMergeStages =
         PSO.CreateInfo.super_PipelineStateCreateInfo.PSODesc.ResourceLayout.
         DefaultVariableMergeStages;
    ResourceLayout.NumVariables =
         PSO.CreateInfo.super_PipelineStateCreateInfo.PSODesc.ResourceLayout.NumVariables;
    ResourceLayout._12_4_ =
         PSO.CreateInfo.super_PipelineStateCreateInfo.PSODesc.ResourceLayout._12_4_;
    Strings._M_h._M_buckets = &Strings._M_h._M_single_bucket;
    Strings._M_h._M_bucket_count = 1;
    Strings._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    Strings._M_h._M_element_count = 0;
    Strings._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    Strings._M_h._M_rehash_policy._M_next_resize = 0;
    Strings._M_h._M_single_bucket = (__node_base_ptr)0x0;
    std::
    vector<Diligent::ShaderResourceVariableDesc,std::allocator<Diligent::ShaderResourceVariableDesc>>
    ::vector<Diligent::ShaderResourceVariableDesc_const*,void>
              ((vector<Diligent::ShaderResourceVariableDesc,std::allocator<Diligent::ShaderResourceVariableDesc>>
                *)&Variables,
               PSO.CreateInfo.super_PipelineStateCreateInfo.PSODesc.ResourceLayout.Variables,
               PSO.CreateInfo.super_PipelineStateCreateInfo.PSODesc.ResourceLayout.Variables +
               (PSO.CreateInfo.super_PipelineStateCreateInfo.PSODesc.ResourceLayout._8_8_ &
               0xffffffff),(allocator_type *)&_msg);
    for (pSVar13 = Variables.
                   super__Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pSVar13 !=
        Variables.
        super__Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
        ._M_impl.super__Vector_impl_data._M_finish; pSVar13 = pSVar13 + 1) {
      pVar14 = std::
               _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               ::_M_emplace<char_const*&>
                         ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                           *)&Strings,pSVar13);
      pSVar13->Name =
           *(Char **)((long)pVar14.first.
                            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            ._M_cur.
                            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     + 8);
    }
    std::vector<Diligent::ImmutableSamplerDesc,std::allocator<Diligent::ImmutableSamplerDesc>>::
    vector<Diligent::ImmutableSamplerDesc_const*,void>
              ((vector<Diligent::ImmutableSamplerDesc,std::allocator<Diligent::ImmutableSamplerDesc>>
                *)&ImmutableSamplers,ResourceLayout.ImmutableSamplers,
               ResourceLayout.ImmutableSamplers + (ResourceLayout._24_8_ & 0xffffffff),
               (allocator_type *)&_msg);
    for (pIVar10 = ImmutableSamplers.
                   super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pIVar10 !=
        ImmutableSamplers.
        super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
        ._M_impl.super__Vector_impl_data._M_finish; pIVar10 = pIVar10 + 1) {
      pVar14 = std::
               _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               ::_M_emplace<char_const*&>
                         ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                           *)&Strings,&pIVar10->SamplerOrTextureName);
      pIVar10->SamplerOrTextureName =
           *(Char **)((long)pVar14.first.
                            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            ._M_cur.
                            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     + 8);
    }
    ResourceLayout.Variables =
         Variables.
         super__Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
         ._M_impl.super__Vector_impl_data._M_start;
    ResourceLayout.ImmutableSamplers =
         ImmutableSamplers.
         super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
         ._M_impl.super__Vector_impl_data._M_start;
    std::
    vector<Diligent::IPipelineResourceSignature*,std::allocator<Diligent::IPipelineResourceSignature*>>
    ::vector<Diligent::IPipelineResourceSignature**,void>
              ((vector<Diligent::IPipelineResourceSignature*,std::allocator<Diligent::IPipelineResourceSignature*>>
                *)&pSignatures,PSO.CreateInfo.super_PipelineStateCreateInfo.ppResourceSignatures,
               PSO.CreateInfo.super_PipelineStateCreateInfo.ppResourceSignatures +
               PSO.CreateInfo.super_PipelineStateCreateInfo.ResourceSignaturesCount,
               (allocator_type *)&_msg);
    (*UnpackInfo->ModifyPipelineStateCreateInfo)
              (&PSO.CreateInfo.super_PipelineStateCreateInfo,UnpackInfo->pUserData);
    if (PVar5 == PSO.CreateInfo.super_PipelineStateCreateInfo.PSODesc.PipelineType) {
      bVar6 = PipelineResourceLayoutDesc::IsEqual
                        (&ResourceLayout,
                         &PSO.CreateInfo.super_PipelineStateCreateInfo.PSODesc.ResourceLayout,false,
                         true);
      if (bVar6) {
        lVar11 = 0;
        do {
          if ((ResourceLayout._24_8_ & 0xffffffff) * 0x48 + 0x48 == lVar11 + 0x48) {
            uVar9 = (ulong)PSO.CreateInfo.super_PipelineStateCreateInfo.ResourceSignaturesCount;
            if ((long)pSignatures.
                      super__Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)pSignatures.
                      super__Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3 != uVar9) {
              FormatString<char[58]>
                        (&_msg,(char (*) [58])
                               "Changing the number of resource signatures is not allowed");
              if (DebugMessageCallback != (undefined *)0x0) {
                (*(code *)DebugMessageCallback)(2,_msg._M_dataplus._M_p,0,0,0);
              }
              goto LAB_003e03c2;
            }
            uVar12 = 0;
            goto LAB_003e0241;
          }
          lVar3 = lVar11 + -0x2c;
          lVar4 = lVar11 + -0x2c;
          lVar11 = lVar11 + 0x48;
        } while (*(int *)((long)((ResourceLayout.ImmutableSamplers)->Desc).BorderColor + lVar3) ==
                 *(int *)((long)((PSO.CreateInfo.super_PipelineStateCreateInfo.PSODesc.
                                  ResourceLayout.ImmutableSamplers)->Desc).BorderColor + lVar4));
        FormatString<char[80]>
                  (&_msg,(char (*) [80])
                         "Modifying immutable sampler shader stages in the resource layout is not allowed"
                  );
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)(2,_msg._M_dataplus._M_p,0,0,0);
        }
      }
      else {
        FormatString<char[84]>
                  (&_msg,(char (*) [84])
                         "Only immutable sampler descriptions in the pipeline resource layout can be modified"
                  );
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)(2,_msg._M_dataplus._M_p,0,0,0);
        }
      }
    }
    else {
      FormatString<char[39]>(&_msg,(char (*) [39])"Modifying pipeline type is not allowed");
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(2,_msg._M_dataplus._M_p,0,0,0);
      }
    }
LAB_003e03c2:
    std::__cxx11::string::~string((string *)&_msg);
    std::
    _Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
    ::~_Vector_base(&pSignatures.
                     super__Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
                   );
    std::
    _Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>::
    ~_Vector_base(&ImmutableSamplers.
                   super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
                 );
    std::
    _Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
    ::~_Vector_base(&Variables.
                     super__Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
                   );
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&Strings._M_h);
    goto LAB_003e03fa;
  }
LAB_003e0329:
  (*(UnpackInfo->pDevice->super_IObject)._vptr_IObject[9])
            (UnpackInfo->pDevice,&PSO.CreateInfo,ppPSO);
  if (UnpackInfo->ModifyPipelineStateCreateInfo ==
      (_func_void_PipelineStateCreateInfo_ptr_void_ptr *)0x0) {
    NamedResourceCache<Diligent::IPipelineState>::Set
              (&(this->m_Cache).PSO,GraphicsPipeline,UnpackInfo->Name,*ppPSO);
  }
LAB_003e03fa:
  PSOData<Diligent::GraphicsPipelineStateCreateInfo>::~PSOData(&PSO);
  return;
LAB_003e0241:
  if (uVar9 <= uVar12) goto LAB_003e02f3;
  pIVar1 = pSignatures.
           super__Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar12];
  pIVar2 = PSO.CreateInfo.super_PipelineStateCreateInfo.ppResourceSignatures[uVar12];
  if (pIVar1 != pIVar2) {
    if ((pIVar1 == (IPipelineResourceSignature *)0x0) !=
        (pIVar2 == (IPipelineResourceSignature *)0x0)) {
      FormatString<char[75]>
                (&_msg,(char (*) [75])
                       "Changing non-null resource signature to null and vice versa is not allowed")
      ;
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(2,_msg._M_dataplus._M_p,0,0,0);
      }
      goto LAB_003e03c2;
    }
    if ((pIVar1 != (IPipelineResourceSignature *)0x0) &&
       (pIVar2 != (IPipelineResourceSignature *)0x0)) {
      iVar7 = (*(pIVar1->super_IDeviceObject).super_IObject._vptr_IObject[4])();
      iVar8 = (*(pIVar2->super_IDeviceObject).super_IObject._vptr_IObject[4])(pIVar2);
      bVar6 = PipelineResourceSignaturesCompatible
                        ((PipelineResourceSignatureDesc *)CONCAT44(extraout_var_00,iVar7),
                         (PipelineResourceSignatureDesc *)CONCAT44(extraout_var_01,iVar8),true);
      if (!bVar6) {
        FormatString<char[134]>
                  (&_msg,(char (*) [134])
                         "When changing pipeline resource signatures, only immutable sampler descriptions in new signatures are allowed to differ from original"
                  );
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)(2,_msg._M_dataplus._M_p,0,0,0);
        }
        goto LAB_003e03c2;
      }
      uVar9 = (ulong)PSO.CreateInfo.super_PipelineStateCreateInfo.ResourceSignaturesCount;
    }
  }
  uVar12 = uVar12 + 1;
  goto LAB_003e0241;
LAB_003e02f3:
  std::
  _Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
  ::~_Vector_base(&pSignatures.
                   super__Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
                 );
  std::_Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
  ::~_Vector_base(&ImmutableSamplers.
                   super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
                 );
  std::
  _Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
  ::~_Vector_base(&Variables.
                   super__Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
                 );
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&Strings._M_h);
  goto LAB_003e0329;
}

Assistant:

void DearchiverBase::UnpackPipelineStateImpl(const PipelineStateUnpackInfo& UnpackInfo,
                                             IPipelineState**               ppPSO)
{
    VERIFY_EXPR(UnpackInfo.pDevice != nullptr);

    constexpr auto ResType = PSOData<CreateInfoType>::ArchiveResType;

    // Do not cache modified PSOs
    if (UnpackInfo.ModifyPipelineStateCreateInfo == nullptr)
    {
        // Since PSO names must be unique (for each PSO type), we use a single cache for all
        // loaded archives.
        if (m_Cache.PSO.Get(ResType, UnpackInfo.Name, ppPSO))
            return;
    }

    // Find the archive that contains this PSO
    ArchiveData* pArchiveData = FindArchive(ResType, UnpackInfo.Name);
    if (pArchiveData == nullptr)
        return;

    PSOData<CreateInfoType> PSO{GetRawAllocator()};
    if (!pArchiveData->pObjArchive->LoadResourceCommonData(ResType, UnpackInfo.Name, PSO))
        return;

#ifdef DILIGENT_DEVELOPMENT
    if (UnpackInfo.pDevice->GetDeviceInfo().IsD3DDevice())
    {
        // We always have reflection information in Direct3D shaders, so always
        // load it in development build to allow the engine verify bindings.
        PSO.InternalCI.Flags &= ~PSO_CREATE_INTERNAL_FLAG_NO_SHADER_REFLECTION;
    }
#endif

    if (!UnpackPSORenderPass(PSO, UnpackInfo.pDevice))
        return;

    if (!UnpackPSOSignatures(PSO, UnpackInfo.pDevice))
        return;

    if (!UnpackPSOShaders(*pArchiveData, PSO, UnpackInfo.pDevice))
        return;

    PSO.AssignShaders();

    PSO.CreateInfo.PSODesc.SRBAllocationGranularity = UnpackInfo.SRBAllocationGranularity;
    PSO.CreateInfo.PSODesc.ImmediateContextMask     = UnpackInfo.ImmediateContextMask;
    PSO.CreateInfo.pPSOCache                        = UnpackInfo.pCache;

    if (!ModifyPipelineStateCreateInfo(PSO.CreateInfo, UnpackInfo))
        return;

    PSO.CreatePipeline(UnpackInfo.pDevice, ppPSO);

    if (UnpackInfo.ModifyPipelineStateCreateInfo == nullptr)
        m_Cache.PSO.Set(ResType, UnpackInfo.Name, *ppPSO);
}